

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAWInteractionType.hpp
# Opt level: O0

void __thiscall
OpenMD::MAWInteractionType::MAWInteractionType
          (MAWInteractionType *this,RealType myD0,RealType myBeta0,RealType myR0,RealType myCa1,
          RealType myCb1)

{
  NonBondedInteractionType *in_RDI;
  _func_int **in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  AtomType *in_XMM3_Qa;
  AtomType *in_XMM4_Qa;
  NonBondedInteractionType *in_stack_ffffffffffffffc0;
  
  NonBondedInteractionType::NonBondedInteractionType(in_stack_ffffffffffffffc0);
  in_RDI->_vptr_NonBondedInteractionType = (_func_int **)&PTR__MAWInteractionType_0050f518;
  in_RDI[1]._vptr_NonBondedInteractionType = in_XMM0_Qa;
  in_RDI[1].nbitp.is_LennardJones = (bool)(char)in_XMM1_Qa;
  in_RDI[1].nbitp.is_Morse = (bool)(char)((ulong)in_XMM1_Qa >> 8);
  in_RDI[1].nbitp.is_MAW = (bool)(char)((ulong)in_XMM1_Qa >> 0x10);
  in_RDI[1].nbitp.is_EAMTable = (bool)(char)((ulong)in_XMM1_Qa >> 0x18);
  in_RDI[1].nbitp.is_EAMZhou = (bool)(char)((ulong)in_XMM1_Qa >> 0x20);
  in_RDI[1].nbitp.is_EAMOxides = (bool)(char)((ulong)in_XMM1_Qa >> 0x28);
  in_RDI[1].nbitp.is_SC = (bool)(char)((ulong)in_XMM1_Qa >> 0x30);
  in_RDI[1].nbitp.is_RepulsivePower = (bool)(char)((ulong)in_XMM1_Qa >> 0x38);
  *(undefined8 *)&in_RDI[1].nbitp.is_Mie = in_XMM2_Qa;
  in_RDI[1].atomTypes_.first = in_XMM3_Qa;
  in_RDI[1].atomTypes_.second = in_XMM4_Qa;
  NonBondedInteractionType::setMAW(in_RDI);
  return;
}

Assistant:

MAWInteractionType(RealType myD0, RealType myBeta0, RealType myR0,
                       RealType myCa1, RealType myCb1) {
      D_e  = myD0;
      beta = myBeta0;
      r_e  = myR0;
      ca1  = myCa1;
      cb1  = myCb1;
      setMAW();
    }